

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

uint sfc::default_palette_count_for_mode(Mode mode)

{
  uint local_c;
  Mode mode_local;
  
  switch(mode) {
  case snes:
  case gbc:
    local_c = 8;
    break;
  case snes_mode7:
  case gb:
  case gba_affine:
    local_c = 1;
    break;
  case gba:
  case pce:
  case pce_sprite:
  case ws:
  case wsc:
  case wsc_packed:
  case ngpc:
    local_c = 0x10;
    break;
  case md:
    local_c = 4;
    break;
  case ngp:
  case sms:
    local_c = 2;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

constexpr unsigned default_palette_count_for_mode(Mode mode) {
  switch (mode) {
  case Mode::snes_mode7:
  case Mode::gb:
  case Mode::gba_affine:
    return 1;
  case Mode::ngp:
  case Mode::sms:
    return 2;
  case Mode::md:
    return 4;
  case Mode::snes:
  case Mode::gbc:
    return 8;
  case Mode::gba:
  case Mode::pce:
  case Mode::pce_sprite:
  case Mode::ws:
  case Mode::wsc:
  case Mode::wsc_packed:
  case Mode::ngpc:
    return 16;
  default:
    return 0;
  }
}